

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_extract.cpp
# Opt level: O1

ScalarFunction * duckdb::MapExtractValueFun::GetFunction(void)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  LogicalType varargs;
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  ScalarFunction *in_RDI;
  long lVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  initializer_list<duckdb::LogicalType> __l;
  undefined4 in_stack_ffffffffffffff14;
  undefined4 in_stack_ffffffffffffff1c;
  FunctionNullHandling in_stack_ffffffffffffff28;
  bind_lambda_function_t in_stack_ffffffffffffff30;
  scalar_function_t local_c8;
  LogicalType local_a8 [3];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_60;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  LogicalType local_38;
  
  LogicalType::LogicalType(local_a8,ANY);
  LogicalType::LogicalType(local_a8 + 1,ANY);
  __l._M_len = 2;
  __l._M_array = local_a8;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_60,__l,(allocator_type *)&stack0xffffffffffffff37);
  LogicalType::LogicalType(local_a8 + 2,ANY);
  local_c8.super__Function_base._M_functor._8_8_ = 0;
  local_c8.super__Function_base._M_functor._M_unused._M_object = MapExtractValueFunc;
  local_c8._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_c8.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_38,INVALID);
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._0_4_ = 0;
  varargs._0_8_ = &local_38;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._4_4_ = in_stack_ffffffffffffff14;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_4_ = 0;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = in_stack_ffffffffffffff1c;
  ScalarFunction::ScalarFunction
            (in_RDI,(vector<duckdb::LogicalType,_true> *)&local_60,local_a8 + 2,&local_c8,
             MapExtractBind<true>,(bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,
             (init_local_state_t)0x0,varargs,CONSISTENT,in_stack_ffffffffffffff28,
             in_stack_ffffffffffffff30);
  LogicalType::~LogicalType(&local_38);
  if (local_c8.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_c8.super__Function_base._M_manager)
              ((_Any_data *)&local_c8,(_Any_data *)&local_c8,__destroy_functor);
  }
  LogicalType::~LogicalType(local_a8 + 2);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_60);
  lVar3 = 0x18;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_a8[0].id_ + lVar3));
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  LogicalType::LogicalType(local_a8,ANY);
  _Var2._M_pi = local_a8[0].type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
  peVar1 = local_a8[0].type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (in_RDI->super_BaseScalarFunction).super_SimpleFunction.varargs.id_ = local_a8[0].id_;
  (in_RDI->super_BaseScalarFunction).super_SimpleFunction.varargs.physical_type_ =
       local_a8[0].physical_type_;
  uVar4 = *(undefined4 *)
           &(in_RDI->super_BaseScalarFunction).super_SimpleFunction.varargs.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar5 = *(undefined4 *)
           ((long)&(in_RDI->super_BaseScalarFunction).super_SimpleFunction.varargs.type_info_.
                   internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr + 4);
  uVar6 = *(undefined4 *)
           &(in_RDI->super_BaseScalarFunction).super_SimpleFunction.varargs.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  uVar7 = *(undefined4 *)
           ((long)&(in_RDI->super_BaseScalarFunction).super_SimpleFunction.varargs.type_info_.
                   internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount + 4);
  (in_RDI->super_BaseScalarFunction).super_SimpleFunction.varargs.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  (in_RDI->super_BaseScalarFunction).super_SimpleFunction.varargs.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_a8[0].type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  local_a8[0].type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this = (in_RDI->super_BaseScalarFunction).super_SimpleFunction.varargs.type_info_.internal.
         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (in_RDI->super_BaseScalarFunction).super_SimpleFunction.varargs.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
  (in_RDI->super_BaseScalarFunction).super_SimpleFunction.varargs.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_48 = uVar4;
    uStack_44 = uVar5;
    uStack_40 = uVar6;
    uStack_3c = uVar7;
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
    uVar4 = local_48;
    uVar5 = uStack_44;
    uVar6 = uStack_40;
    uVar7 = uStack_3c;
  }
  _Var2._M_pi = local_a8[0].type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
  local_a8[0].type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)CONCAT44(uVar5,uVar4);
  local_a8[0].type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       uVar7;
  local_a8[0].type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ =
       uVar6;
  if (_Var2._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var2._M_pi);
  }
  LogicalType::~LogicalType(local_a8);
  (in_RDI->super_BaseScalarFunction).null_handling = SPECIAL_HANDLING;
  return in_RDI;
}

Assistant:

ScalarFunction MapExtractValueFun::GetFunction() {
	ScalarFunction fun({LogicalType::ANY, LogicalType::ANY}, LogicalType::ANY, MapExtractValueFunc,
	                   MapExtractBind<true>);
	fun.varargs = LogicalType::ANY;
	fun.null_handling = FunctionNullHandling::SPECIAL_HANDLING;
	return fun;
}